

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O3

re_t re_compile(char *pattern)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uchar uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  byte bVar10;
  int iVar11;
  
  bVar10 = *pattern;
  uVar3 = 0;
  if (bVar10 != 0) {
    iVar2 = 1;
    lVar6 = 0;
    lVar9 = 0;
    uVar8 = 1;
LAB_00112b59:
    uVar3 = uVar8;
    uVar7 = (uint)lVar9;
    if (bVar10 < 0x3f) {
      if (bVar10 < 0x2b) {
        if (bVar10 == 0x24) {
          re_compile::re_compiled[lVar6].type = '\x03';
        }
        else {
          if (bVar10 != 0x2a) goto LAB_00112ce5;
          re_compile::re_compiled[lVar6].type = '\x05';
        }
      }
      else if (bVar10 == 0x2b) {
        re_compile::re_compiled[lVar6].type = '\x06';
      }
      else {
        if (bVar10 != 0x2e) goto LAB_00112ce5;
        re_compile::re_compiled[lVar6].type = '\x01';
      }
    }
    else if (bVar10 < 0x5c) {
      if (bVar10 == 0x3f) {
        re_compile::re_compiled[lVar6].type = '\x04';
      }
      else {
        if (bVar10 == 0x5b) {
          uVar1 = uVar7 + 1;
          if (pattern[(long)(int)uVar7 + 1] != '^') {
            uVar1 = uVar7;
          }
          re_compile::re_compiled[lVar6].type = pattern[(long)(int)uVar7 + 1] == '^' | 8;
          uVar8 = (ulong)uVar1;
          iVar11 = iVar2;
          do {
            lVar9 = (long)(int)uVar8;
            uVar4 = pattern[lVar9 + 1];
            if (uVar4 == '\\') {
              if (0x26 < iVar11) {
                return (re_t)0x0;
              }
              lVar5 = (long)iVar11;
              iVar11 = iVar11 + 1;
              re_compile::ccl_buf[lVar5] = '\\';
              uVar4 = pattern[lVar9 + 2];
              uVar8 = lVar9 + 2;
            }
            else {
              uVar8 = lVar9 + 1;
              uVar7 = (uint)uVar8;
              if ((uVar4 == '\0') || (uVar4 == ']')) goto LAB_00112cfb;
              if (0x27 < iVar11) {
                return (re_t)0x0;
              }
            }
            lVar9 = (long)iVar11;
            iVar11 = iVar11 + 1;
            re_compile::ccl_buf[lVar9] = uVar4;
          } while( true );
        }
LAB_00112ce5:
        re_compile::re_compiled[lVar6].type = '\a';
        re_compile::re_compiled[lVar6].field_1.ch = bVar10;
      }
    }
    else if (bVar10 == 0x5c) {
      bVar10 = pattern[(long)(int)uVar7 + 1];
      lVar9 = (long)(int)uVar7 + 1;
      if (bVar10 < 0x57) {
        if (bVar10 == 0) goto LAB_00112d9a;
        if (bVar10 == 0x44) {
          re_compile::re_compiled[lVar6].type = '\v';
        }
        else {
          if (bVar10 != 0x53) goto LAB_00112d58;
          re_compile::re_compiled[lVar6].type = '\x0f';
        }
      }
      else if (bVar10 < 0x73) {
        if (bVar10 == 0x57) {
          re_compile::re_compiled[lVar6].type = '\r';
        }
        else if (bVar10 == 100) {
          re_compile::re_compiled[lVar6].type = '\n';
        }
        else {
LAB_00112d58:
          re_compile::re_compiled[lVar6].type = '\a';
          re_compile::re_compiled[lVar6].field_1.ch = pattern[lVar9];
        }
      }
      else if (bVar10 == 0x73) {
        re_compile::re_compiled[lVar6].type = '\x0e';
      }
      else {
        if (bVar10 != 0x77) goto LAB_00112d58;
        re_compile::re_compiled[lVar6].type = '\f';
      }
      uVar7 = (uint)lVar9;
    }
    else {
      if (bVar10 != 0x5e) goto LAB_00112ce5;
      re_compile::re_compiled[lVar6].type = '\x02';
    }
    goto LAB_00112d9a;
  }
LAB_00112dbe:
  re_compile::re_compiled[uVar3].type = '\0';
  return re_compile::re_compiled;
LAB_00112cfb:
  if (0x27 < iVar11) {
    return (re_t)0x0;
  }
  re_compile::ccl_buf[iVar11] = '\0';
  re_compile::re_compiled[lVar6].field_1.ccl = re_compile::ccl_buf + iVar2;
  iVar2 = iVar11 + 1;
LAB_00112d9a:
  bVar10 = pattern[(long)(int)uVar7 + 1];
  if (bVar10 == 0) goto LAB_00112dbb;
  lVar9 = (long)(int)uVar7 + 1;
  lVar6 = lVar6 + 1;
  uVar8 = uVar3 + 1;
  if (0x1c < uVar3) goto LAB_00112dbb;
  goto LAB_00112b59;
LAB_00112dbb:
  uVar3 = uVar3 & 0xffffffff;
  goto LAB_00112dbe;
}

Assistant:

re_t re_compile(const char* pattern)
{
  /* The sizes of the two static arrays below substantiates the static RAM usage of this module.
     MAX_REGEXP_OBJECTS is the max number of symbols in the expression.
     MAX_CHAR_CLASS_LEN determines the size of buffer for chars in all char-classes in the expression. */
  static regex_t re_compiled[MAX_REGEXP_OBJECTS];
  static unsigned char ccl_buf[MAX_CHAR_CLASS_LEN];
  int ccl_bufidx = 1;

  char c;     /* current char in pattern   */
  int i = 0;  /* index into pattern        */
  int j = 0;  /* index into re_compiled    */

  while (pattern[i] != '\0' && (j+1 < MAX_REGEXP_OBJECTS))
  {
    c = pattern[i];

    switch (c)
    {
      /* Meta-characters: */
      case '^': {    re_compiled[j].type = BEGIN;           } break;
      case '$': {    re_compiled[j].type = END;             } break;
      case '.': {    re_compiled[j].type = DOT;             } break;
      case '*': {    re_compiled[j].type = STAR;            } break;
      case '+': {    re_compiled[j].type = PLUS;            } break;
      case '?': {    re_compiled[j].type = QUESTIONMARK;    } break;
/*    case '|': {    re_compiled[j].type = BRANCH;          } break; <-- not working properly */

      /* Escaped character-classes (\s \w ...): */
      case '\\':
      {
        if (pattern[i+1] != '\0')
        {
          /* Skip the escape-char '\\' */
          i += 1;
          /* ... and check the next */
          switch (pattern[i])
          {
            /* Meta-character: */
            case 'd': {    re_compiled[j].type = DIGIT;            } break;
            case 'D': {    re_compiled[j].type = NOT_DIGIT;        } break;
            case 'w': {    re_compiled[j].type = ALPHA;            } break;
            case 'W': {    re_compiled[j].type = NOT_ALPHA;        } break;
            case 's': {    re_compiled[j].type = WHITESPACE;       } break;
            case 'S': {    re_compiled[j].type = NOT_WHITESPACE;   } break;

            /* Escaped character, e.g. '.' or '$' */ 
            default:  
            {
              re_compiled[j].type = CHAR;
              re_compiled[j].ch = pattern[i];
            } break;
          }
        }
        /* '\\' as last char in pattern -> invalid regular expression. */
/*
        else
        { 
          re_compiled[j].type = CHAR;
          re_compiled[j].ch = pattern[i];
        }
*/
      } break;

      /* Character class: */
      case '[':
      {
        /* Remember where the char-buffer starts. */
        int buf_begin = ccl_bufidx;

        /* Look-ahead to determine if negated */
        if (pattern[i+1] == '^')
        {
          re_compiled[j].type = INV_CHAR_CLASS;
          i += 1; /* Increment i to avoid including '^' in the char-buffer */
        }  
        else
        {
          re_compiled[j].type = CHAR_CLASS;
        }

        /* Copy characters inside [..] to buffer */
        while (    (pattern[++i] != ']')
                && (pattern[i]   != '\0')) /* Missing ] */
        {
          if (pattern[i] == '\\')
          {
            if (ccl_bufidx >= MAX_CHAR_CLASS_LEN - 1)
            {
              //fputs("exceeded internal buffer!\n", stderr);
              return 0;
            }
            ccl_buf[ccl_bufidx++] = pattern[i++];
          }
          else if (ccl_bufidx >= MAX_CHAR_CLASS_LEN)
          {
              //fputs("exceeded internal buffer!\n", stderr);
              return 0;
          }
          ccl_buf[ccl_bufidx++] = pattern[i];
        }
        if (ccl_bufidx >= MAX_CHAR_CLASS_LEN)
        {
            /* Catches cases such as [00000000000000000000000000000000000000][ */
            //fputs("exceeded internal buffer!\n", stderr);
            return 0;
        }
        /* Null-terminate string end */
        ccl_buf[ccl_bufidx++] = 0;
        re_compiled[j].ccl = &ccl_buf[buf_begin];
      } break;

      /* Other characters: */
      default:
      {
        re_compiled[j].type = CHAR;
        re_compiled[j].ch = c;
      } break;
    }
    i += 1;
    j += 1;
  }
  /* 'UNUSED' is a sentinel used to indicate end-of-pattern */
  re_compiled[j].type = UNUSED;

  return (re_t) re_compiled;
}